

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O0

word If_Dec6ComposeLut4(int t,word *f)

{
  ulong local_38;
  ulong local_30;
  word r;
  word c;
  int v;
  int m;
  word *f_local;
  int t_local;
  
  local_30 = 0;
  for (c._4_4_ = 0; c._4_4_ < 0x10; c._4_4_ = c._4_4_ + 1) {
    if ((t >> ((byte)c._4_4_ & 0x1f) & 1U) != 0) {
      r = 0xffffffffffffffff;
      for (c._0_4_ = 0; (int)c < 4; c._0_4_ = (int)c + 1) {
        if ((c._4_4_ >> ((byte)(int)c & 0x1f) & 1U) == 0) {
          local_38 = f[(int)c] ^ 0xffffffffffffffff;
        }
        else {
          local_38 = f[(int)c];
        }
        r = local_38 & r;
      }
      local_30 = r | local_30;
    }
  }
  return local_30;
}

Assistant:

static word If_Dec6ComposeLut4( int t, word f[4] )
{
    int m, v;
    word c, r = 0;
    for ( m = 0; m < 16; m++ )
    {
        if ( !((t >> m) & 1) )
            continue;
        c = ~(word)0;
        for ( v = 0; v < 4; v++ )
            c &= ((m >> v) & 1) ? f[v] : ~f[v];
        r |= c;
    }
    return r;
}